

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

StringRef __thiscall
Catch::Detail::anon_unknown_0::extractInstanceName(anon_unknown_0 *this,StringRef enumInstance)

{
  char cVar1;
  size_type sVar2;
  bool bVar3;
  StringRef SVar4;
  size_type local_30;
  size_t name_start;
  StringRef enumInstance_local;
  
  enumInstance_local.m_start = enumInstance.m_start;
  name_start = (size_t)this;
  local_30 = StringRef::size((StringRef *)&name_start);
  while( true ) {
    bVar3 = false;
    if (local_30 != 0) {
      cVar1 = StringRef::operator[]((StringRef *)&name_start,local_30 - 1);
      bVar3 = cVar1 != ':';
    }
    if (!bVar3) break;
    local_30 = local_30 - 1;
  }
  sVar2 = StringRef::size((StringRef *)&name_start);
  SVar4 = StringRef::substr((StringRef *)&name_start,local_30,sVar2 - local_30);
  return SVar4;
}

Assistant:

StringRef extractInstanceName(StringRef enumInstance) {
                // Find last occurrence of ":"
                size_t name_start = enumInstance.size();
                while (name_start > 0 && enumInstance[name_start - 1] != ':') {
                    --name_start;
                }
                return enumInstance.substr(name_start, enumInstance.size() - name_start);
            }